

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

void rw::ps2::calcTEX1(Raster *raster,uint64 *tex1,int32 filter)

{
  ushort uVar1;
  ulong uVar2;
  
  uVar1 = *(ushort *)((long)&raster->privateFlags + (long)nativeRasterOffset);
  uVar2 = (ulong)((uVar1 & 0x3000) << 7) |
          (ulong)(uVar1 & 0xfff) << 0x20 |
          (ulong)*(byte *)((long)&raster->privateFlags + (long)nativeRasterOffset + 2);
  switch(filter) {
  case 2:
    uVar2 = uVar2 | 0x60;
    break;
  case 3:
    uVar2 = uVar2 | 0x80;
    break;
  case 4:
    uVar2 = uVar2 | 0x120;
    break;
  case 5:
    uVar2 = uVar2 | 0xc0;
    break;
  case 6:
    uVar2 = uVar2 | 0x160;
  }
  *tex1 = uVar2;
  return;
}

Assistant:

void
calcTEX1(Raster *raster, uint64 *tex1, int32 filter)
{
	enum {
		NEAREST = 0,
		LINEAR,
		NEAREST_MIPMAP_NEAREST,
		NEAREST_MIPMAP_LINEAR,
		LINEAR_MIPMAP_NEAREST,
		LINEAR_MIPMAP_LINEAR,
	};
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	uint64 t1 = natras->tex1low;
	uint64 k = natras->kl & 0xFFF;
	uint64 l = (natras->kl >> 12) & 0x3;
	t1 |= k << 32;
	t1 |= l << 19;
	switch(filter){
	case Texture::NEAREST:
		t1 |= (NEAREST << 5) |
		      (NEAREST << 6);
		break;
	case Texture::LINEAR:
		t1 |= (LINEAR << 5) |
		      (LINEAR << 6);
		break;
	case Texture::MIPNEAREST:
		t1 |= (NEAREST << 5) |
		      (NEAREST_MIPMAP_NEAREST << 6);
		break;
	case Texture::MIPLINEAR:
		t1 |= (LINEAR << 5) |
		      (LINEAR_MIPMAP_NEAREST << 6);
		break;
	case Texture::LINEARMIPNEAREST:
		t1 |= (NEAREST << 5) |
		      (NEAREST_MIPMAP_LINEAR << 6);
		break;
	case Texture::LINEARMIPLINEAR:
		t1 |= (LINEAR << 5) |
		      (LINEAR_MIPMAP_LINEAR << 6);
		break;
	}
	*tex1 = t1;
}